

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx2::SphereMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 extraout_var [56];
  undefined4 uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar43 [36];
  undefined1 auVar42 [64];
  float fVar44;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar56 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [28];
  undefined1 auVar62 [64];
  undefined1 auVar63 [28];
  undefined1 auVar65 [64];
  undefined1 auVar66 [28];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [28];
  undefined1 auVar71 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  HitK<4> h;
  undefined8 local_350;
  undefined8 uStack_348;
  Primitive *local_340;
  undefined4 local_334;
  RTCFilterFunctionNArguments local_330;
  undefined1 local_300 [32];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  uint local_80 [4];
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar55 [64];
  undefined1 auVar57 [64];
  undefined1 auVar61 [32];
  undefined1 auVar64 [32];
  
  pSVar5 = context->scene;
  local_80[0] = sphere->sharedGeomID;
  pGVar6 = (pSVar5->geometries).items[local_80[0]].ptr;
  lVar23 = *(long *)&pGVar6->field_0x58;
  _Var7 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar29._16_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[4] * _Var7);
  auVar29._0_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar32._16_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[5] * _Var7);
  auVar32._0_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[6] * _Var7);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[7] * _Var7);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar23 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar56 = vunpcklps_avx(auVar29,auVar39);
  auVar34 = vunpckhps_avx(auVar29,auVar39);
  auVar39 = vunpcklps_avx(auVar32,auVar41);
  auVar29 = vunpckhps_avx(auVar32,auVar41);
  auVar12 = vunpcklps_avx(auVar56,auVar39);
  auVar56 = vunpckhps_avx(auVar56,auVar39);
  auVar39 = vunpcklps_avx(auVar34,auVar29);
  auVar32 = vunpckhps_avx(auVar34,auVar29);
  bVar4 = sphere->numPrimitives;
  auVar26._1_3_ = 0;
  auVar26[0] = bVar4;
  auVar26[4] = bVar4;
  auVar26._5_3_ = 0;
  auVar26[8] = bVar4;
  auVar26._9_3_ = 0;
  auVar26[0xc] = bVar4;
  auVar26._13_3_ = 0;
  auVar26[0x10] = bVar4;
  auVar26._17_3_ = 0;
  auVar26[0x14] = bVar4;
  auVar26._21_3_ = 0;
  auVar26[0x18] = bVar4;
  auVar26._25_3_ = 0;
  auVar26[0x1c] = bVar4;
  auVar26._29_3_ = 0;
  auVar26 = vpcmpgtd_avx2(auVar26,_DAT_0205a920);
  local_80[1] = local_80[0];
  local_80[2] = local_80[0];
  local_80[3] = local_80[0];
  uStack_70 = local_80[0];
  uStack_6c = local_80[0];
  uStack_68 = local_80[0];
  uStack_64 = local_80[0];
  uVar35 = *(undefined4 *)(ray + k * 4);
  auVar51._4_4_ = uVar35;
  auVar51._0_4_ = uVar35;
  auVar51._8_4_ = uVar35;
  auVar51._12_4_ = uVar35;
  auVar51._16_4_ = uVar35;
  auVar51._20_4_ = uVar35;
  auVar51._24_4_ = uVar35;
  auVar51._28_4_ = uVar35;
  auVar29 = vsubps_avx(auVar12,auVar51);
  uVar35 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar52._4_4_ = uVar35;
  auVar52._0_4_ = uVar35;
  auVar52._8_4_ = uVar35;
  auVar52._12_4_ = uVar35;
  auVar52._16_4_ = uVar35;
  auVar52._20_4_ = uVar35;
  auVar52._24_4_ = uVar35;
  auVar52._28_4_ = uVar35;
  auVar56 = vsubps_avx(auVar56,auVar52);
  uVar35 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar36._4_4_ = uVar35;
  auVar36._0_4_ = uVar35;
  auVar36._8_4_ = uVar35;
  auVar36._12_4_ = uVar35;
  auVar36._16_4_ = uVar35;
  auVar36._20_4_ = uVar35;
  auVar36._24_4_ = uVar35;
  auVar36._28_4_ = uVar35;
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar61._4_4_ = fVar1;
  auVar61._0_4_ = fVar1;
  auVar61._8_4_ = fVar1;
  auVar61._12_4_ = fVar1;
  auVar61._16_4_ = fVar1;
  auVar61._20_4_ = fVar1;
  auVar61._24_4_ = fVar1;
  auVar61._28_4_ = fVar1;
  auVar62 = ZEXT3264(auVar61);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  auVar64._4_4_ = fVar2;
  auVar64._0_4_ = fVar2;
  auVar64._8_4_ = fVar2;
  auVar64._12_4_ = fVar2;
  auVar64._16_4_ = fVar2;
  auVar64._20_4_ = fVar2;
  auVar64._24_4_ = fVar2;
  auVar64._28_4_ = fVar2;
  auVar65 = ZEXT3264(auVar64);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar67 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  auVar39 = vsubps_avx(auVar39,auVar36);
  auVar31 = vfmadd231ps_fma(ZEXT432((uint)(fVar3 * fVar3)),auVar64,auVar64);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar61,auVar61);
  uVar35 = auVar31._0_4_;
  auVar45._4_4_ = uVar35;
  auVar45._0_4_ = uVar35;
  auVar45._8_4_ = uVar35;
  auVar45._12_4_ = uVar35;
  auVar45._16_4_ = uVar35;
  auVar45._20_4_ = uVar35;
  auVar45._24_4_ = uVar35;
  auVar45._28_4_ = uVar35;
  auVar34 = vrcpps_avx(auVar45);
  auVar37._8_4_ = 0x3f800000;
  auVar37._0_8_ = &DAT_3f8000003f800000;
  auVar37._12_4_ = 0x3f800000;
  auVar37._16_4_ = 0x3f800000;
  auVar37._20_4_ = 0x3f800000;
  auVar37._24_4_ = 0x3f800000;
  auVar37._28_4_ = 0x3f800000;
  auVar31 = vfnmadd231ps_fma(auVar37,auVar34,auVar45);
  auVar31 = vfmadd132ps_fma(ZEXT1632(auVar31),auVar34,auVar34);
  auVar12._4_4_ = fVar3 * auVar39._4_4_;
  auVar12._0_4_ = fVar3 * auVar39._0_4_;
  auVar12._8_4_ = fVar3 * auVar39._8_4_;
  auVar12._12_4_ = fVar3 * auVar39._12_4_;
  auVar12._16_4_ = fVar3 * auVar39._16_4_;
  auVar12._20_4_ = fVar3 * auVar39._20_4_;
  auVar12._24_4_ = fVar3 * auVar39._24_4_;
  auVar12._28_4_ = uVar35;
  auVar25 = vfmadd231ps_fma(auVar12,auVar56,auVar64);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar29,auVar61);
  fVar44 = auVar25._0_4_ * auVar31._0_4_;
  fVar48 = auVar25._4_4_ * auVar31._4_4_;
  fVar49 = auVar25._8_4_ * auVar31._8_4_;
  fVar50 = auVar25._12_4_ * auVar31._12_4_;
  auVar13._4_4_ = fVar1 * fVar48;
  auVar13._0_4_ = fVar1 * fVar44;
  auVar13._8_4_ = fVar1 * fVar49;
  auVar13._12_4_ = fVar1 * fVar50;
  auVar13._16_4_ = fVar1 * 0.0;
  auVar13._20_4_ = fVar1 * 0.0;
  auVar13._24_4_ = fVar1 * 0.0;
  auVar13._28_4_ = auVar34._28_4_;
  auVar59._0_4_ = fVar2 * fVar44;
  auVar59._4_4_ = fVar2 * fVar48;
  auVar59._8_4_ = fVar2 * fVar49;
  auVar59._12_4_ = fVar2 * fVar50;
  auVar59._16_4_ = fVar2 * 0.0;
  auVar59._20_4_ = fVar2 * 0.0;
  auVar59._28_36_ = in_ZMM8._28_36_;
  auVar59._24_4_ = fVar2 * 0.0;
  auVar53._0_4_ = fVar3 * fVar44;
  auVar53._4_4_ = fVar3 * fVar48;
  auVar53._8_4_ = fVar3 * fVar49;
  auVar53._12_4_ = fVar3 * fVar50;
  auVar53._16_4_ = fVar3 * 0.0;
  auVar53._20_4_ = fVar3 * 0.0;
  auVar53._28_36_ = in_ZMM9._28_36_;
  auVar53._24_4_ = fVar3 * 0.0;
  auVar12 = vsubps_avx(auVar29,auVar13);
  auVar68 = ZEXT3264(auVar12);
  auVar56 = vsubps_avx(auVar56,auVar59._0_32_);
  auVar69 = ZEXT3264(auVar56);
  auVar39 = vsubps_avx(auVar39,auVar53._0_32_);
  auVar59 = ZEXT3264(auVar39);
  auVar34._4_4_ = auVar39._4_4_ * auVar39._4_4_;
  auVar34._0_4_ = auVar39._0_4_ * auVar39._0_4_;
  auVar34._8_4_ = auVar39._8_4_ * auVar39._8_4_;
  auVar34._12_4_ = auVar39._12_4_ * auVar39._12_4_;
  auVar34._16_4_ = auVar39._16_4_ * auVar39._16_4_;
  auVar34._20_4_ = auVar39._20_4_ * auVar39._20_4_;
  auVar34._24_4_ = auVar39._24_4_ * auVar39._24_4_;
  auVar34._28_4_ = auVar29._28_4_;
  auVar25 = vfmadd231ps_fma(auVar34,auVar56,auVar56);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar12,auVar12);
  auVar14._4_4_ = auVar32._4_4_ * auVar32._4_4_;
  auVar14._0_4_ = auVar32._0_4_ * auVar32._0_4_;
  auVar14._8_4_ = auVar32._8_4_ * auVar32._8_4_;
  auVar14._12_4_ = auVar32._12_4_ * auVar32._12_4_;
  auVar14._16_4_ = auVar32._16_4_ * auVar32._16_4_;
  auVar14._20_4_ = auVar32._20_4_ * auVar32._20_4_;
  auVar14._24_4_ = auVar32._24_4_ * auVar32._24_4_;
  auVar14._28_4_ = auVar32._28_4_;
  auVar34 = vcmpps_avx(ZEXT1632(auVar25),auVar14,2);
  auVar29 = auVar26 & auVar34;
  if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar29 >> 0x7f,0) != '\0') ||
        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar29 >> 0xbf,0) != '\0') ||
      (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0') {
    auVar34 = vandps_avx(auVar34,auVar26);
    auVar40 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
    auVar34 = vsubps_avx(auVar14,ZEXT1632(auVar25));
    auVar15._4_4_ = auVar31._4_4_ * auVar34._4_4_;
    auVar15._0_4_ = auVar31._0_4_ * auVar34._0_4_;
    auVar15._8_4_ = auVar31._8_4_ * auVar34._8_4_;
    auVar15._12_4_ = auVar31._12_4_ * auVar34._12_4_;
    auVar15._16_4_ = auVar34._16_4_ * 0.0;
    auVar15._20_4_ = auVar34._20_4_ * 0.0;
    auVar15._24_4_ = auVar34._24_4_ * 0.0;
    auVar15._28_4_ = auVar34._28_4_;
    auVar32 = vsqrtps_avx(auVar15);
    auVar71 = ZEXT3264(auVar32);
    auVar26 = vsubps_avx(ZEXT1632(CONCAT412(fVar50,CONCAT48(fVar49,CONCAT44(fVar48,fVar44)))),
                         auVar32);
    auVar54._0_4_ = auVar32._0_4_ + fVar44;
    auVar54._4_4_ = auVar32._4_4_ + fVar48;
    auVar54._8_4_ = auVar32._8_4_ + fVar49;
    auVar54._12_4_ = auVar32._12_4_ + fVar50;
    auVar54._16_4_ = auVar32._16_4_ + 0.0;
    auVar54._20_4_ = auVar32._20_4_ + 0.0;
    auVar54._24_4_ = auVar32._24_4_ + 0.0;
    auVar54._28_4_ = auVar32._28_4_ + 0.0;
    auVar55 = ZEXT3264(auVar54);
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar38._4_4_ = uVar35;
    auVar38._0_4_ = uVar35;
    auVar38._8_4_ = uVar35;
    auVar38._12_4_ = uVar35;
    auVar38._16_4_ = uVar35;
    auVar38._20_4_ = uVar35;
    auVar38._24_4_ = uVar35;
    auVar38._28_4_ = uVar35;
    auVar34 = vcmpps_avx(auVar38,auVar26,2);
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar46._4_4_ = uVar35;
    auVar46._0_4_ = uVar35;
    auVar46._8_4_ = uVar35;
    auVar46._12_4_ = uVar35;
    auVar46._16_4_ = uVar35;
    auVar46._20_4_ = uVar35;
    auVar46._24_4_ = uVar35;
    auVar46._28_4_ = uVar35;
    auVar29 = vcmpps_avx(auVar26,auVar46,2);
    auVar34 = vandps_avx(auVar34,auVar29);
    auVar31 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
    auVar25 = vpand_avx(auVar31,auVar40);
    auVar53 = ZEXT1664(auVar25);
    auVar34 = vcmpps_avx(auVar38,auVar54,2);
    auVar29 = vcmpps_avx(auVar54,auVar46,2);
    auVar34 = vandps_avx(auVar34,auVar29);
    auVar31 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
    local_2d0 = vpand_avx(auVar31,auVar40);
    auVar31 = vpor_avx(local_2d0,auVar25);
    local_300 = vpmovsxwd_avx2(auVar31);
    if ((((((((local_300 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_300 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_300 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_300 >> 0x7f,0) != '\0') ||
          (local_300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_300 >> 0xbf,0) != '\0') ||
        (local_300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_300[0x1f] < '\0') {
      auVar29 = vpmovsxwd_avx2(auVar25);
      local_2a0 = vblendvps_avx(auVar54,auVar26,auVar29);
      auVar33._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
      auVar33._8_4_ = -auVar32._8_4_;
      auVar33._12_4_ = -auVar32._12_4_;
      auVar33._16_4_ = -auVar32._16_4_;
      auVar33._20_4_ = -auVar32._20_4_;
      auVar33._24_4_ = -auVar32._24_4_;
      auVar33._28_4_ = -auVar32._28_4_;
      auVar34 = vblendvps_avx(auVar32,auVar33,auVar29);
      fVar44 = auVar34._0_4_;
      fVar48 = auVar34._4_4_;
      auVar16._4_4_ = fVar1 * fVar48;
      auVar16._0_4_ = fVar1 * fVar44;
      fVar49 = auVar34._8_4_;
      auVar16._8_4_ = fVar1 * fVar49;
      fVar50 = auVar34._12_4_;
      auVar16._12_4_ = fVar1 * fVar50;
      fVar9 = auVar34._16_4_;
      auVar16._16_4_ = fVar1 * fVar9;
      fVar10 = auVar34._20_4_;
      auVar16._20_4_ = fVar1 * fVar10;
      fVar11 = auVar34._24_4_;
      auVar16._24_4_ = fVar1 * fVar11;
      auVar16._28_4_ = 0x80000000;
      auVar17._4_4_ = fVar2 * fVar48;
      auVar17._0_4_ = fVar2 * fVar44;
      auVar17._8_4_ = fVar2 * fVar49;
      auVar17._12_4_ = fVar2 * fVar50;
      auVar17._16_4_ = fVar2 * fVar9;
      auVar17._20_4_ = fVar2 * fVar10;
      auVar17._24_4_ = fVar2 * fVar11;
      auVar17._28_4_ = auVar29._28_4_;
      auVar18._4_4_ = fVar3 * fVar48;
      auVar18._0_4_ = fVar3 * fVar44;
      auVar18._8_4_ = fVar3 * fVar49;
      auVar18._12_4_ = fVar3 * fVar50;
      auVar18._16_4_ = fVar3 * fVar9;
      auVar18._20_4_ = fVar3 * fVar10;
      auVar18._24_4_ = fVar3 * fVar11;
      auVar18._28_4_ = auVar34._28_4_;
      local_280 = vsubps_avx(auVar16,auVar12);
      local_260 = vsubps_avx(auVar17,auVar56);
      local_240 = vsubps_avx(auVar18,auVar39);
      auVar47 = ZEXT3264(local_2a0);
      auVar34 = vpmovzxwd_avx2(auVar31);
      auVar34 = vpslld_avx2(auVar34,0x1f);
      auVar56._8_4_ = 0x7f800000;
      auVar56._0_8_ = 0x7f8000007f800000;
      auVar56._12_4_ = 0x7f800000;
      auVar56._16_4_ = 0x7f800000;
      auVar56._20_4_ = 0x7f800000;
      auVar56._24_4_ = 0x7f800000;
      auVar56._28_4_ = 0x7f800000;
      auVar57 = ZEXT3264(auVar56);
      auVar34 = vblendvps_avx(auVar56,local_2a0,auVar34);
      auVar29 = vshufps_avx(auVar34,auVar34,0xb1);
      auVar29 = vminps_avx(auVar34,auVar29);
      auVar56 = vshufpd_avx(auVar29,auVar29,5);
      auVar29 = vminps_avx(auVar29,auVar56);
      auVar39 = vpermpd_avx2(auVar29,0x4e);
      auVar29 = vminps_avx(auVar29,auVar39);
      auVar29 = vcmpps_avx(auVar34,auVar29,0);
      auVar56 = local_300 & auVar29;
      auVar34 = local_300;
      if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar56 >> 0x7f,0) != '\0') ||
            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar56 >> 0xbf,0) != '\0') ||
          (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar56[0x1f] < '\0') {
        auVar34 = vandps_avx(auVar29,local_300);
      }
      uVar21 = vmovmskps_avx(auVar34);
      uVar22 = 0;
      for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
        uVar22 = uVar22 + 1;
      }
      lVar23 = (long)(1 << ((uint)k & 0x1f)) * 0x10;
      auVar58 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      do {
        auVar60 = auVar62._0_28_;
        local_330.hit = (RTCHitN *)&local_210;
        local_330.valid = (int *)&local_350;
        auVar34 = auVar59._0_32_;
        auVar56 = auVar69._0_32_;
        auVar29 = auVar68._0_32_;
        auVar66 = auVar67._0_28_;
        auVar63 = auVar65._0_28_;
        auVar70 = auVar71._0_28_;
        auVar43 = ZEXT436(auVar39._28_4_);
        uVar24 = (ulong)uVar22;
        uVar22 = local_80[uVar24];
        pGVar6 = (pSVar5->geometries).items[uVar22].ptr;
        local_330.ray = (RTCRayN *)ray;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_300 + uVar24 * 4) = 0;
          auVar43 = ZEXT436(auVar39._28_4_);
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_280 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_260 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_240 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[uVar24];
            *(uint *)(ray + k * 4 + 0x120) = uVar22;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_017f3324:
            uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar28._4_4_ = uVar35;
            auVar28._0_4_ = uVar35;
            auVar28._8_4_ = uVar35;
            auVar28._12_4_ = uVar35;
            auVar28._16_4_ = uVar35;
            auVar28._20_4_ = uVar35;
            auVar28._24_4_ = uVar35;
            auVar28._28_4_ = uVar35;
            auVar25 = vpand_avx(auVar53._0_16_,local_2d0);
            local_2a0 = auVar55._0_32_;
            auVar39 = vcmpps_avx(local_2a0,auVar28,2);
            auVar31 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
            auVar31 = vpand_avx(auVar31,auVar25);
            auVar39 = vpmovzxwd_avx2(auVar31);
            auVar39 = vpslld_avx2(auVar39,0x1f);
            if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar39 >> 0x7f,0) == '\0') &&
                  (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0xbf,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar39[0x1f]) {
              return;
            }
            local_300 = vpsrad_avx2(auVar39,0x1f);
            fVar1 = auVar70._0_4_;
            auVar65._0_4_ = auVar60._0_4_ * fVar1;
            fVar2 = auVar70._4_4_;
            auVar65._4_4_ = auVar60._4_4_ * fVar2;
            fVar3 = auVar70._8_4_;
            auVar65._8_4_ = auVar60._8_4_ * fVar3;
            fVar44 = auVar70._12_4_;
            auVar65._12_4_ = auVar60._12_4_ * fVar44;
            fVar48 = auVar70._16_4_;
            auVar65._16_4_ = auVar60._16_4_ * fVar48;
            fVar49 = auVar70._20_4_;
            auVar65._20_4_ = auVar60._20_4_ * fVar49;
            fVar50 = auVar70._24_4_;
            auVar65._24_4_ = auVar60._24_4_ * fVar50;
            auVar65._28_36_ = auVar43;
            auVar67._0_4_ = auVar63._0_4_ * fVar1;
            auVar67._4_4_ = auVar63._4_4_ * fVar2;
            auVar67._8_4_ = auVar63._8_4_ * fVar3;
            auVar67._12_4_ = auVar63._12_4_ * fVar44;
            auVar67._16_4_ = auVar63._16_4_ * fVar48;
            auVar67._20_4_ = auVar63._20_4_ * fVar49;
            auVar67._28_36_ = auVar47._28_36_;
            auVar67._24_4_ = auVar63._24_4_ * fVar50;
            auVar68._0_4_ = auVar66._0_4_ * fVar1;
            auVar68._4_4_ = auVar66._4_4_ * fVar2;
            auVar68._8_4_ = auVar66._8_4_ * fVar3;
            auVar68._12_4_ = auVar66._12_4_ * fVar44;
            auVar68._16_4_ = auVar66._16_4_ * fVar48;
            auVar68._20_4_ = auVar66._20_4_ * fVar49;
            auVar68._28_36_ = auVar53._28_36_;
            auVar68._24_4_ = auVar66._24_4_ * fVar50;
            local_280 = vsubps_avx(auVar65._0_32_,auVar29);
            local_260 = vsubps_avx(auVar67._0_32_,auVar56);
            local_240 = vsubps_avx(auVar68._0_32_,auVar34);
            pSVar5 = context->scene;
            auVar29 = vblendvps_avx(auVar57._0_32_,local_2a0,auVar39);
            auVar56 = vshufps_avx(auVar29,auVar29,0xb1);
            auVar56 = vminps_avx(auVar29,auVar56);
            auVar39 = vshufpd_avx(auVar56,auVar56,5);
            auVar56 = vminps_avx(auVar56,auVar39);
            auVar39 = vpermpd_avx2(auVar56,0x4e);
            auVar56 = vminps_avx(auVar56,auVar39);
            auVar29 = vcmpps_avx(auVar29,auVar56,0);
            auVar25 = vpackssdw_avx(auVar29._0_16_,auVar29._16_16_);
            auVar31 = vpand_avx(auVar25,auVar31);
            auVar29 = vpmovzxwd_avx2(auVar31);
            auVar29 = vpslld_avx2(auVar29,0x1f);
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0x7f,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0xbf,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar29[0x1f]) {
              auVar29 = local_300;
            }
            uVar21 = vmovmskps_avx(auVar29);
            uVar22 = 0;
            for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
              uVar22 = uVar22 + 1;
            }
            lVar23 = (long)(1 << ((uint)k & 0x1f)) * 0x10;
            auVar59 = ZEXT864(0) << 0x20;
            auVar34 = vpcmpeqd_avx2(auVar34,auVar34);
            auVar53 = ZEXT3264(auVar34);
            auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar31 = vpcmpeqd_avx(auVar63._0_16_,auVar63._0_16_);
            auVar65 = ZEXT1664(auVar31);
            do {
              local_330.hit = (RTCHitN *)&local_210;
              local_330.valid = (int *)&local_350;
              local_2e0 = auVar58._0_16_;
              uVar24 = (ulong)uVar22;
              local_1b0._4_4_ = local_80[uVar24];
              pGVar6 = (pSVar5->geometries).items[(uint)local_1b0._4_4_].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_300 + uVar24 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_280 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_260 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_240 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[uVar24];
                  *(undefined4 *)(ray + k * 4 + 0x120) = local_1b0._4_4_;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                local_1c0._4_4_ = (sphere->primIDs).field_0.i[uVar24];
                local_210 = *(undefined4 *)(local_280 + uVar24 * 4);
                local_200._4_4_ = *(undefined4 *)(local_260 + uVar24 * 4);
                uVar35 = *(undefined4 *)(local_240 + uVar24 * 4);
                local_1f0._4_4_ = uVar35;
                local_1f0._0_4_ = uVar35;
                local_1f0._8_4_ = uVar35;
                local_1f0._12_4_ = uVar35;
                uStack_20c = local_210;
                uStack_208 = local_210;
                uStack_204 = local_210;
                local_200._0_4_ = local_200._4_4_;
                local_200._8_4_ = local_200._4_4_;
                local_200._12_4_ = local_200._4_4_;
                local_1e0 = auVar59._0_32_;
                local_1c0._0_4_ = local_1c0._4_4_;
                local_1c0._8_4_ = local_1c0._4_4_;
                local_1c0._12_4_ = local_1c0._4_4_;
                local_1b0._0_4_ = local_1b0._4_4_;
                local_1b0._8_4_ = local_1b0._4_4_;
                local_1b0._12_4_ = local_1b0._4_4_;
                uStack_19c = context->user->instID[0];
                local_1a0 = uStack_19c;
                uStack_198 = uStack_19c;
                uStack_194 = uStack_19c;
                uStack_190 = context->user->instPrimID[0];
                uStack_18c = uStack_190;
                uStack_188 = uStack_190;
                uStack_184 = uStack_190;
                local_2d0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar24 * 4);
                local_350 = *(undefined8 *)(mm_lookupmask_ps + lVar23);
                uStack_348 = *(undefined8 *)(mm_lookupmask_ps + lVar23 + 8);
                local_330.geometryUserPtr = pGVar6->userPtr;
                local_330.context = context->user;
                local_330.N = 4;
                local_2c0 = auVar55._0_32_;
                local_330.ray = (RTCRayN *)ray;
                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar34 = ZEXT1632(auVar53._0_16_);
                  auVar31 = auVar65._0_16_;
                  local_340 = sphere;
                  (*pGVar6->intersectionFilterN)(&local_330);
                  auVar31 = vpcmpeqd_avx(auVar31,auVar31);
                  auVar65 = ZEXT1664(auVar31);
                  auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar34 = vpcmpeqd_avx2(auVar34,auVar34);
                  auVar53 = ZEXT3264(auVar34);
                  auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar55 = ZEXT3264(local_2c0);
                  sphere = local_340;
                }
                auVar40._8_8_ = uStack_348;
                auVar40._0_8_ = local_350;
                auVar31 = auVar65._0_16_;
                if (auVar40 == (undefined1  [16])0x0) {
                  auVar25 = vpcmpeqd_avx(auVar62._0_16_,(undefined1  [16])0x0);
                  auVar31 = auVar31 ^ auVar25;
                  auVar58 = ZEXT1664(local_2e0);
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar34 = ZEXT1632(auVar53._0_16_);
                    (*p_Var8)(&local_330);
                    auVar31 = vpcmpeqd_avx(auVar31,auVar31);
                    auVar65 = ZEXT1664(auVar31);
                    auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar34 = vpcmpeqd_avx2(auVar34,auVar34);
                    auVar53 = ZEXT3264(auVar34);
                    auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar55 = ZEXT3264(local_2c0);
                  }
                  auVar20._8_8_ = uStack_348;
                  auVar20._0_8_ = local_350;
                  auVar25 = vpcmpeqd_avx(auVar62._0_16_,auVar20);
                  auVar31 = auVar65._0_16_ ^ auVar25;
                  auVar58 = ZEXT1664(local_2e0);
                  if (auVar20 != (undefined1  [16])0x0) {
                    auVar25 = auVar65._0_16_ ^ auVar25;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])local_330.hit);
                    *(undefined1 (*) [16])(local_330.ray + 0xc0) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x10));
                    *(undefined1 (*) [16])(local_330.ray + 0xd0) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x20));
                    *(undefined1 (*) [16])(local_330.ray + 0xe0) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x30));
                    *(undefined1 (*) [16])(local_330.ray + 0xf0) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x40));
                    *(undefined1 (*) [16])(local_330.ray + 0x100) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x50));
                    *(undefined1 (*) [16])(local_330.ray + 0x110) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x60));
                    *(undefined1 (*) [16])(local_330.ray + 0x120) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x70));
                    *(undefined1 (*) [16])(local_330.ray + 0x130) = auVar40;
                    auVar25 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_330.hit + 0x80));
                    *(undefined1 (*) [16])(local_330.ray + 0x140) = auVar25;
                  }
                }
                if ((auVar58._0_16_ & auVar31) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_2d0._0_4_;
                }
                *(undefined4 *)(local_300 + uVar24 * 4) = 0;
                uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar30._4_4_ = uVar35;
                auVar30._0_4_ = uVar35;
                auVar30._8_4_ = uVar35;
                auVar30._12_4_ = uVar35;
                auVar30._16_4_ = uVar35;
                auVar30._20_4_ = uVar35;
                auVar30._24_4_ = uVar35;
                auVar30._28_4_ = uVar35;
                auVar34 = vcmpps_avx(auVar55._0_32_,auVar30,2);
                local_300 = vandps_avx(auVar34,local_300);
              }
              if ((((((((local_300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_300 >> 0x7f,0) == '\0') &&
                    (local_300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_300 >> 0xbf,0) == '\0') &&
                  (local_300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_300[0x1f]) {
                return;
              }
              auVar34 = vblendvps_avx(auVar57._0_32_,auVar55._0_32_,local_300);
              auVar29 = vshufps_avx(auVar34,auVar34,0xb1);
              auVar29 = vminps_avx(auVar34,auVar29);
              auVar56 = vshufpd_avx(auVar29,auVar29,5);
              auVar29 = vminps_avx(auVar29,auVar56);
              auVar56 = vpermpd_avx2(auVar29,0x4e);
              auVar29 = vminps_avx(auVar29,auVar56);
              auVar29 = vcmpps_avx(auVar34,auVar29,0);
              auVar56 = local_300 & auVar29;
              auVar34 = local_300;
              if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar56 >> 0x7f,0) != '\0') ||
                    (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar56 >> 0xbf,0) != '\0') ||
                  (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar56[0x1f] < '\0') {
                auVar34 = vandps_avx(auVar29,local_300);
              }
              uVar21 = vmovmskps_avx(auVar34);
              uVar22 = 0;
              for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
                uVar22 = uVar22 + 1;
              }
            } while( true );
          }
          local_a0 = auVar47._0_32_;
          local_1b0._4_4_ = uVar22;
          local_1b0._0_4_ = uVar22;
          local_1b0._8_4_ = uVar22;
          local_1b0._12_4_ = uVar22;
          uVar22 = (sphere->primIDs).field_0.i[uVar24];
          auVar31._4_4_ = uVar22;
          auVar31._0_4_ = uVar22;
          auVar31._8_4_ = uVar22;
          auVar31._12_4_ = uVar22;
          local_210 = *(undefined4 *)(local_280 + uVar24 * 4);
          uVar35 = *(undefined4 *)(local_260 + uVar24 * 4);
          local_200._4_4_ = uVar35;
          local_200._0_4_ = uVar35;
          local_200._8_4_ = uVar35;
          local_200._12_4_ = uVar35;
          auVar42 = ZEXT1664(local_200);
          local_1f0._4_4_ = *(undefined4 *)(local_240 + uVar24 * 4);
          uStack_20c = local_210;
          uStack_208 = local_210;
          uStack_204 = local_210;
          local_1f0._0_4_ = local_1f0._4_4_;
          local_1f0._8_4_ = local_1f0._4_4_;
          local_1f0._12_4_ = local_1f0._4_4_;
          local_1e0 = ZEXT432(0) << 0x20;
          local_1c0 = auVar31;
          vpcmpeqd_avx2(ZEXT1632(local_1b0),ZEXT1632(local_1b0));
          uStack_19c = context->user->instID[0];
          local_1a0 = uStack_19c;
          uStack_198 = uStack_19c;
          uStack_194 = uStack_19c;
          uStack_190 = context->user->instPrimID[0];
          uStack_18c = uStack_190;
          uStack_188 = uStack_190;
          uStack_184 = uStack_190;
          local_334 = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar24 * 4);
          local_350 = *(undefined8 *)(mm_lookupmask_ps + lVar23);
          uStack_348 = *(undefined8 *)(mm_lookupmask_ps + lVar23 + 8);
          local_330.geometryUserPtr = pGVar6->userPtr;
          local_330.context = context->user;
          local_330.N = 4;
          local_2c0 = auVar55._0_32_;
          local_2e0 = auVar58._0_16_;
          local_c0 = auVar62._0_32_;
          local_e0 = auVar65._0_32_;
          local_100 = auVar67._0_32_;
          local_120 = auVar29;
          local_140 = auVar56;
          local_160 = auVar34;
          local_180 = auVar71._0_32_;
          local_220 = auVar53._0_16_;
          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar42 = ZEXT1664(local_200);
            local_340 = sphere;
            (*pGVar6->intersectionFilterN)(&local_330);
            auVar62._8_56_ = extraout_var;
            auVar62._0_8_ = extraout_XMM1_Qa;
            auVar31 = auVar62._0_16_;
            auVar53 = ZEXT1664(local_220);
            auVar71 = ZEXT3264(local_180);
            auVar59 = ZEXT3264(local_160);
            auVar69 = ZEXT3264(local_140);
            auVar68 = ZEXT3264(local_120);
            auVar67 = ZEXT3264(local_100);
            auVar65 = ZEXT3264(local_e0);
            auVar62 = ZEXT3264(local_c0);
            auVar58 = ZEXT1664(local_2e0);
            auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar55 = ZEXT3264(local_2c0);
            sphere = local_340;
          }
          auVar40 = auVar42._0_16_;
          auVar25._8_8_ = uStack_348;
          auVar25._0_8_ = local_350;
          auVar47 = ZEXT3264(local_a0);
          if (auVar25 == (undefined1  [16])0x0) {
            auVar25 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar31 = vpcmpeqd_avx(auVar31,auVar31);
            auVar25 = auVar25 ^ auVar31;
          }
          else {
            p_Var8 = context->args->filter;
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&local_330);
              auVar47 = ZEXT3264(local_a0);
              auVar53 = ZEXT1664(local_220);
              auVar71 = ZEXT3264(local_180);
              auVar59 = ZEXT3264(local_160);
              auVar69 = ZEXT3264(local_140);
              auVar68 = ZEXT3264(local_120);
              auVar67 = ZEXT3264(local_100);
              auVar65 = ZEXT3264(local_e0);
              auVar62 = ZEXT3264(local_c0);
              auVar58 = ZEXT1664(local_2e0);
              auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar55 = ZEXT3264(local_2c0);
            }
            auVar19._8_8_ = uStack_348;
            auVar19._0_8_ = local_350;
            auVar31 = vpcmpeqd_avx(auVar19,_DAT_01feba10);
            auVar40 = vpcmpeqd_avx(auVar40,auVar40);
            auVar42 = ZEXT1664(auVar40);
            auVar25 = auVar31 ^ auVar40;
            if (auVar19 != (undefined1  [16])0x0) {
              auVar31 = auVar31 ^ auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])local_330.hit);
              *(undefined1 (*) [16])(local_330.ray + 0xc0) = auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x10));
              *(undefined1 (*) [16])(local_330.ray + 0xd0) = auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x20));
              *(undefined1 (*) [16])(local_330.ray + 0xe0) = auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x30));
              *(undefined1 (*) [16])(local_330.ray + 0xf0) = auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x40));
              *(undefined1 (*) [16])(local_330.ray + 0x100) = auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x50));
              *(undefined1 (*) [16])(local_330.ray + 0x110) = auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x60));
              *(undefined1 (*) [16])(local_330.ray + 0x120) = auVar40;
              auVar40 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x70));
              *(undefined1 (*) [16])(local_330.ray + 0x130) = auVar40;
              auVar31 = vmaskmovps_avx(auVar31,*(undefined1 (*) [16])(local_330.hit + 0x80));
              *(undefined1 (*) [16])(local_330.ray + 0x140) = auVar31;
            }
          }
          if ((auVar58._0_16_ & auVar25) == (undefined1  [16])0x0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_334;
          }
          *(undefined4 *)(local_300 + uVar24 * 4) = 0;
          uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar27._4_4_ = uVar35;
          auVar27._0_4_ = uVar35;
          auVar27._8_4_ = uVar35;
          auVar27._12_4_ = uVar35;
          auVar27._16_4_ = uVar35;
          auVar27._20_4_ = uVar35;
          auVar27._24_4_ = uVar35;
          auVar27._28_4_ = uVar35;
          auVar34 = vcmpps_avx(auVar47._0_32_,auVar27,2);
          local_300 = vandps_avx(auVar34,local_300);
          auVar43 = auVar42._28_36_;
        }
        auVar60 = auVar62._0_28_;
        auVar34 = auVar59._0_32_;
        auVar56 = auVar69._0_32_;
        auVar29 = auVar68._0_32_;
        auVar66 = auVar67._0_28_;
        auVar63 = auVar65._0_28_;
        auVar70 = auVar71._0_28_;
        if ((((((((local_300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_300 >> 0x7f,0) == '\0') &&
              (local_300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_300 >> 0xbf,0) == '\0') &&
            (local_300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_300[0x1f]) goto LAB_017f3324;
        auVar34 = vblendvps_avx(auVar57._0_32_,auVar47._0_32_,local_300);
        auVar29 = vshufps_avx(auVar34,auVar34,0xb1);
        auVar29 = vminps_avx(auVar34,auVar29);
        auVar56 = vshufpd_avx(auVar29,auVar29,5);
        auVar29 = vminps_avx(auVar29,auVar56);
        auVar39 = vpermpd_avx2(auVar29,0x4e);
        auVar29 = vminps_avx(auVar29,auVar39);
        auVar29 = vcmpps_avx(auVar34,auVar29,0);
        auVar56 = local_300 & auVar29;
        auVar34 = local_300;
        if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar56 >> 0x7f,0) != '\0') ||
              (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar56 >> 0xbf,0) != '\0') ||
            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar56[0x1f] < '\0') {
          auVar34 = vandps_avx(auVar29,local_300);
        }
        uVar21 = vmovmskps_avx(auVar34);
        uVar22 = 0;
        for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
          uVar22 = uVar22 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }